

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::operator+(String *this,uint8 *s)

{
  char *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar1;
  String SVar2;
  
  String(this,(String *)s);
  puVar1 = extraout_RDX;
  if (in_RDX != (char *)0x0) {
    operator+=(this,in_RDX);
    puVar1 = extraout_RDX_00;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = this;
  return (String)SVar2.super_tagbstring;
}

Assistant:

const String String::operator+(const uint8 * s) const
    {
        String retval(*this);
        if (s == NULL)    return retval;
        retval +=(char *) s;
        return retval;
    }